

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool sense_stuff(effect_handler_context_t_conflict *context,_func__Bool_object_ptr *pred,
                 object_kind *unknown_kind)

{
  _Bool _Var1;
  int iVar2;
  loc grid;
  object *obj;
  int iVar3;
  int iVar4;
  int iVar5;
  int y;
  int iVar6;
  
  iVar5 = (player->grid).x;
  iVar3 = (player->grid).y;
  y = iVar3 - context->y;
  iVar3 = context->y + iVar3;
  iVar2 = iVar5 - context->x;
  iVar5 = context->x + iVar5;
  iVar6 = 0;
  if (y < 1) {
    y = iVar6;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar4 = cave->height + -1;
  if (iVar3 < cave->height) {
    iVar4 = iVar3;
  }
  iVar3 = cave->width + -1;
  if (iVar5 < cave->width) {
    iVar3 = iVar5;
  }
  for (; iVar5 = iVar2, y <= iVar4; y = y + 1) {
    for (; iVar5 <= iVar3; iVar5 = iVar5 + 1) {
      grid = (loc)loc(iVar5,y);
      for (obj = square_object(cave,grid); (iVar6 == 0 && (obj != (object *)0x0)); obj = obj->next)
      {
        _Var1 = (*pred)(obj);
        if ((_Var1) &&
           (((obj->known == (object *)0x0 || (obj->known->kind == unknown_kind)) ||
            (_Var1 = ignore_item_ok(player,obj), !_Var1)))) {
          iVar6 = 1;
        }
      }
      square_sense_pile(cave,grid,pred);
    }
  }
  return SUB41(iVar6,0);
}

Assistant:

static bool sense_stuff(effect_handler_context_t *context,
		bool (*pred)(const struct object*),
		const struct object_kind *unknown_kind)
{
	int x, y;
	int x1, x2, y1, y2;

	bool have_stuff = false;

	/* Pick an area to sense */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the area */
	for (y = y1; y <= y2; y++) {
		for (x = x1; x <= x2; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(cave, grid);

			for (; !have_stuff && obj; obj = obj->next) {
				if ((*pred)(obj)
						&& (!obj->known
						|| obj->known->kind == unknown_kind
						|| !ignore_item_ok(player, obj))) {
					have_stuff = true;
				}
			}

			/*
			 * Become aware of the parts of the pile that match
			 * the predicate.  Forget remembered parts that match
			 * the predicate which are no longer there.
			 */
			square_sense_pile(cave, grid, pred);
		}
	}

	return have_stuff;
}